

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_cbc.cc
# Opt level: O3

int EVP_tls_cbc_record_digest_supported(EVP_MD *md)

{
  int iVar1;
  
  iVar1 = EVP_MD_type((EVP_MD *)md);
  return (int)(iVar1 == 0x2a0 || iVar1 == 0x40);
}

Assistant:

int EVP_tls_cbc_record_digest_supported(const EVP_MD *md) {
  switch (EVP_MD_type(md)) {
    case NID_sha1:
    case NID_sha256:
      return 1;
    default:
      return 0;
  }
}